

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vfloat<4> vVar14;
  vbool<4> vVar15;
  undefined4 in_EAX;
  int iVar16;
  uint uVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  RTCRayN *pRVar20;
  undefined4 uVar21;
  int iVar22;
  Intersectors *pIVar23;
  NodeRef root;
  long lVar24;
  uint uVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  NodeRef *pNVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  float fVar43;
  float fVar44;
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar45;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar58;
  float fVar60;
  float fVar62;
  undefined1 auVar54 [16];
  int iVar59;
  int iVar61;
  int iVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  vint4 ai_1;
  undefined1 auVar65 [16];
  float fVar71;
  undefined1 auVar66 [16];
  float fVar70;
  float fVar72;
  undefined1 auVar67 [16];
  float fVar73;
  float fVar74;
  float fVar77;
  float fVar79;
  vint4 ai_3;
  undefined1 auVar75 [16];
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  vint4 bi;
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  vint4 bi_3;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  uint uVar110;
  uint uVar111;
  float fVar112;
  uint uVar113;
  uint uVar114;
  float fVar115;
  uint uVar116;
  uint uVar117;
  float fVar118;
  vint4 ai_2;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  float fVar123;
  uint uVar124;
  uint uVar125;
  float fVar126;
  uint uVar127;
  uint uVar128;
  float fVar129;
  vint4 bi_2;
  uint uVar130;
  uint uVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  TravRayK<4,_false> *tray_00;
  Precalculations pre;
  undefined1 local_19f8 [8];
  undefined8 uStack_19f0;
  undefined1 local_19e8 [8];
  undefined8 uStack_19e0;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined1 local_19a8 [8];
  float fStack_19a0;
  float fStack_199c;
  undefined8 local_1998;
  undefined8 uStack_1990;
  uint local_1948;
  uint uStack_1944;
  uint uStack_1940;
  uint uStack_193c;
  vbool<4> terminated;
  undefined1 local_18c8 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  uint local_1788;
  uint uStack_1784;
  uint uStack_1780;
  uint uStack_177c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined4 local_1748;
  undefined4 uStack_1744;
  undefined4 uStack_1740;
  undefined4 uStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined4 local_1718;
  undefined4 uStack_1714;
  undefined4 uStack_1710;
  undefined4 uStack_170c;
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar52 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar67._8_4_ = 0xffffffff;
    auVar67._0_8_ = 0xffffffffffffffff;
    auVar67._12_4_ = 0xffffffff;
    auVar65 = *(undefined1 (*) [16])(ray + 0x80);
    auVar75._0_12_ = ZEXT812(0);
    auVar75._12_4_ = 0;
    uVar121 = -(uint)(0.0 <= auVar65._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar124 = -(uint)(0.0 <= auVar65._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar127 = -(uint)(0.0 <= auVar65._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar130 = -(uint)(0.0 <= auVar65._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar34._4_4_ = uVar124;
    auVar34._0_4_ = uVar121;
    auVar34._8_4_ = uVar127;
    auVar34._12_4_ = uVar130;
    iVar16 = movmskps(in_EAX,auVar34);
    if (iVar16 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar88 = (float)DAT_01ff1d40;
      fVar92 = DAT_01ff1d40._4_4_;
      fVar96 = DAT_01ff1d40._8_4_;
      fVar100 = DAT_01ff1d40._12_4_;
      auVar84._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar92);
      auVar84._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar88);
      auVar84._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar96);
      auVar84._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar100);
      auVar105 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar84
                         );
      auVar32._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar92);
      auVar32._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar88);
      auVar32._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar96);
      auVar32._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar100);
      auVar47 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar32)
      ;
      auVar33._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar92);
      auVar33._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar88);
      auVar33._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar96);
      auVar33._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar100);
      auVar84 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar33)
      ;
      auVar34 = rcpps(auVar33,auVar105);
      fVar88 = auVar34._0_4_;
      auVar106._0_4_ = auVar105._0_4_ * fVar88;
      fVar92 = auVar34._4_4_;
      auVar106._4_4_ = auVar105._4_4_ * fVar92;
      fVar96 = auVar34._8_4_;
      auVar106._8_4_ = auVar105._8_4_ * fVar96;
      fVar100 = auVar34._12_4_;
      auVar106._12_4_ = auVar105._12_4_ * fVar100;
      tray.rdir.field_0._0_4_ = (1.0 - auVar106._0_4_) * fVar88 + fVar88;
      tray.rdir.field_0._4_4_ = (1.0 - auVar106._4_4_) * fVar92 + fVar92;
      tray.rdir.field_0._8_4_ = (1.0 - auVar106._8_4_) * fVar96 + fVar96;
      tray.rdir.field_0._12_4_ = (1.0 - auVar106._12_4_) * fVar100 + fVar100;
      auVar34 = rcpps(auVar106,auVar47);
      fVar88 = auVar34._0_4_;
      fVar92 = auVar34._4_4_;
      fVar96 = auVar34._8_4_;
      fVar100 = auVar34._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar47._0_4_ * fVar88) * fVar88 + fVar88;
      tray.rdir.field_0._20_4_ = (1.0 - auVar47._4_4_ * fVar92) * fVar92 + fVar92;
      tray.rdir.field_0._24_4_ = (1.0 - auVar47._8_4_ * fVar96) * fVar96 + fVar96;
      tray.rdir.field_0._28_4_ = (1.0 - auVar47._12_4_ * fVar100) * fVar100 + fVar100;
      auVar47 = rcpps(auVar34,auVar84);
      fVar88 = auVar47._0_4_;
      fVar92 = auVar47._4_4_;
      fVar96 = auVar47._8_4_;
      fVar100 = auVar47._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar84._0_4_ * fVar88) * fVar88 + fVar88;
      tray.rdir.field_0._36_4_ = (1.0 - auVar84._4_4_ * fVar92) * fVar92 + fVar92;
      tray.rdir.field_0._40_4_ = (1.0 - auVar84._8_4_ * fVar96) * fVar96 + fVar96;
      tray.rdir.field_0._44_4_ = (1.0 - auVar84._12_4_ * fVar100) * fVar100 + fVar100;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar105._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar105._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar105._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar105._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar105);
      auVar35._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar35._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar35._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar35._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar35);
      auVar34 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar75);
      auVar36._4_4_ = uVar124;
      auVar36._0_4_ = uVar121;
      auVar36._8_4_ = uVar127;
      auVar36._12_4_ = uVar130;
      fVar88 = (float)DAT_01feb9f0;
      fVar92 = DAT_01feb9f0._4_4_;
      fVar96 = DAT_01feb9f0._8_4_;
      fVar100 = DAT_01feb9f0._12_4_;
      _local_19f8 = (__m128)blendvps(_DAT_01feb9f0,auVar34,auVar36);
      auVar65 = maxps(auVar65,auVar75);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar65,auVar36);
      auVar65._4_4_ = uVar124;
      auVar65._0_4_ = uVar121;
      auVar65._8_4_ = uVar127;
      auVar65._12_4_ = uVar130;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar67 ^ auVar65);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = _local_19f8;
      iVar16 = 0x224ff80;
      paVar26 = &stack_near[2].field_0;
      tray.tnear.field_0 = _local_19f8;
LAB_0023ff92:
      paVar27 = paVar26 + -1;
      root.ptr = pNVar28[-1].ptr;
      pNVar28 = pNVar28 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00240c2a;
      local_19b8._0_4_ = paVar27->v[0];
      local_19b8._4_4_ = *(float *)((long)paVar26 + -0xc);
      uStack_19b0._0_4_ = *(float *)((long)paVar26 + -8);
      uStack_19b0._4_4_ = *(float *)((long)paVar26 + -4);
      vVar14.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
      auVar37._4_4_ = -(uint)(local_19b8._4_4_ < tray.tfar.field_0.v[1]);
      auVar37._0_4_ = -(uint)((float)local_19b8 < tray.tfar.field_0.v[0]);
      auVar37._8_4_ = -(uint)((float)uStack_19b0 < tray.tfar.field_0.v[2]);
      auVar37._12_4_ = -(uint)(uStack_19b0._4_4_ < tray.tfar.field_0.v[3]);
      uVar17 = movmskps(iVar16,auVar37);
      if (uVar17 == 0) {
LAB_00240c3b:
        iVar16 = 2;
      }
      else {
        uVar18 = (ulong)(uVar17 & 0xff);
        uVar17 = POPCOUNT(uVar17 & 0xff);
        iVar16 = 0;
        if (uVar17 <= uVar25) {
          do {
            sVar1 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> sVar1 & 1) == 0; sVar1 = sVar1 + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar30 = occluded1(This,bvh,root,sVar1,&pre,ray,tray_00,context);
            if (bVar30) {
              terminated.field_0.i[sVar1] = -1;
            }
            uVar18 = uVar18 & uVar18 - 1;
          } while (uVar18 != 0);
          iVar59 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          iVar16 = 3;
          fVar88 = INFINITY;
          fVar92 = INFINITY;
          fVar96 = INFINITY;
          fVar100 = INFINITY;
          local_19b8._0_4_ = vVar14.field_0._0_4_;
          local_19b8._4_4_ = vVar14.field_0._4_4_;
          uStack_19b0._0_4_ = vVar14.field_0._8_4_;
          uStack_19b0._4_4_ = vVar14.field_0._12_4_;
          if (iVar59 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            iVar16 = 2;
          }
        }
        vVar15.field_0 = terminated.field_0;
        if (uVar25 < uVar17) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00240c2a;
              auVar40._4_4_ = -(uint)(local_19b8._4_4_ < tray.tfar.field_0.v[1]);
              auVar40._0_4_ = -(uint)((float)local_19b8 < tray.tfar.field_0.v[0]);
              auVar40._8_4_ = -(uint)((float)uStack_19b0 < tray.tfar.field_0.v[2]);
              auVar40._12_4_ = -(uint)(uStack_19b0._4_4_ < tray.tfar.field_0.v[3]);
              iVar16 = movmskps(iVar16,auVar40);
              if (iVar16 == 0) goto LAB_00240c3b;
              valid_i = (vint<4> *)((ulong)((uint)root.ptr & 0xf) - 8);
              if ((Intersectors *)valid_i == (Intersectors *)0x0) goto LAB_00240bef;
              auVar66._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar66._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar66._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar24 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              pIVar23 = (Intersectors *)0x0;
              goto LAB_002402de;
            }
            uVar18 = root.ptr & 0xfffffffffffffff0;
            uVar17 = (uint)root.ptr & 7;
            bVar30 = (float)local_19b8 < tray.tfar.field_0.v[0];
            bVar8 = local_19b8._4_4_ < tray.tfar.field_0.v[1];
            bVar9 = (float)uStack_19b0 < tray.tfar.field_0.v[2];
            bVar10 = uStack_19b0._4_4_ < tray.tfar.field_0.v[3];
            pIVar23 = (Intersectors *)0x0;
            root.ptr = 8;
            local_19b8._0_4_ = fVar88;
            local_19b8._4_4_ = fVar92;
            uStack_19b0._0_4_ = fVar96;
            uStack_19b0._4_4_ = fVar100;
            do {
              sVar1 = *(size_t *)(uVar18 + (long)pIVar23 * 8);
              if (sVar1 != 8) {
                fVar45 = *(float *)(uVar18 + 0x80 + (long)pIVar23 * 4);
                fVar64 = *(float *)(uVar18 + 0x20 + (long)pIVar23 * 4);
                fVar87 = *(float *)(uVar18 + 0x30 + (long)pIVar23 * 4);
                fVar71 = *(float *)(uVar18 + 0x40 + (long)pIVar23 * 4);
                fVar89 = *(float *)(uVar18 + 0x50 + (long)pIVar23 * 4);
                auVar65 = *(undefined1 (*) [16])(ray + 0x70);
                fVar53 = auVar65._0_4_;
                fVar58 = auVar65._4_4_;
                fVar60 = auVar65._8_4_;
                fVar62 = auVar65._12_4_;
                fVar73 = *(float *)(uVar18 + 0xa0 + (long)pIVar23 * 4);
                fVar81 = *(float *)(uVar18 + 0xc0 + (long)pIVar23 * 4);
                fVar83 = *(float *)(uVar18 + 0x60 + (long)pIVar23 * 4);
                fVar93 = *(float *)(uVar18 + 0x90 + (long)pIVar23 * 4);
                fVar97 = *(float *)(uVar18 + 0xb0 + (long)pIVar23 * 4);
                fVar101 = *(float *)(uVar18 + 0xd0 + (long)pIVar23 * 4);
                fVar46 = *(float *)(uVar18 + 0x70 + (long)pIVar23 * 4);
                fVar31 = ((fVar45 * fVar53 + fVar64) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar43 = ((fVar45 * fVar58 + fVar64) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar44 = ((fVar45 * fVar60 + fVar64) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar45 = ((fVar45 * fVar62 + fVar64) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar64 = ((fVar73 * fVar53 + fVar71) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar68 = ((fVar73 * fVar58 + fVar71) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar69 = ((fVar73 * fVar60 + fVar71) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar71 = ((fVar73 * fVar62 + fVar71) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar73 = ((fVar81 * fVar53 + fVar83) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar77 = ((fVar81 * fVar58 + fVar83) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar79 = ((fVar81 * fVar60 + fVar83) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar81 = ((fVar81 * fVar62 + fVar83) - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                fVar83 = ((fVar93 * fVar53 + fVar87) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar85 = ((fVar93 * fVar58 + fVar87) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar86 = ((fVar93 * fVar60 + fVar87) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar87 = ((fVar93 * fVar62 + fVar87) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar104 = ((fVar97 * fVar53 + fVar89) - (float)tray.org.field_0._16_4_) *
                          (float)tray.rdir.field_0._16_4_;
                fVar107 = ((fVar97 * fVar58 + fVar89) - (float)tray.org.field_0._20_4_) *
                          (float)tray.rdir.field_0._20_4_;
                fVar108 = ((fVar97 * fVar60 + fVar89) - (float)tray.org.field_0._24_4_) *
                          (float)tray.rdir.field_0._24_4_;
                fVar109 = ((fVar97 * fVar62 + fVar89) - (float)tray.org.field_0._28_4_) *
                          (float)tray.rdir.field_0._28_4_;
                fVar89 = ((fVar101 * fVar53 + fVar46) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar93 = ((fVar101 * fVar58 + fVar46) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar97 = ((fVar101 * fVar60 + fVar46) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar101 = ((fVar101 * fVar62 + fVar46) - (float)tray.org.field_0._44_4_) *
                          (float)tray.rdir.field_0._44_4_;
                uVar110 = (uint)((int)fVar83 < (int)fVar31) * (int)fVar83 |
                          (uint)((int)fVar83 >= (int)fVar31) * (int)fVar31;
                uVar113 = (uint)((int)fVar85 < (int)fVar43) * (int)fVar85 |
                          (uint)((int)fVar85 >= (int)fVar43) * (int)fVar43;
                uVar116 = (uint)((int)fVar86 < (int)fVar44) * (int)fVar86 |
                          (uint)((int)fVar86 >= (int)fVar44) * (int)fVar44;
                uVar119 = (uint)((int)fVar87 < (int)fVar45) * (int)fVar87 |
                          (uint)((int)fVar87 >= (int)fVar45) * (int)fVar45;
                uVar122 = (uint)((int)fVar104 < (int)fVar64) * (int)fVar104 |
                          (uint)((int)fVar104 >= (int)fVar64) * (int)fVar64;
                uVar125 = (uint)((int)fVar107 < (int)fVar68) * (int)fVar107 |
                          (uint)((int)fVar107 >= (int)fVar68) * (int)fVar68;
                uVar128 = (uint)((int)fVar108 < (int)fVar69) * (int)fVar108 |
                          (uint)((int)fVar108 >= (int)fVar69) * (int)fVar69;
                uVar131 = (uint)((int)fVar109 < (int)fVar71) * (int)fVar109 |
                          (uint)((int)fVar109 >= (int)fVar71) * (int)fVar71;
                uVar122 = ((int)uVar122 < (int)uVar110) * uVar110 |
                          ((int)uVar122 >= (int)uVar110) * uVar122;
                uVar125 = ((int)uVar125 < (int)uVar113) * uVar113 |
                          ((int)uVar125 >= (int)uVar113) * uVar125;
                uVar128 = ((int)uVar128 < (int)uVar116) * uVar116 |
                          ((int)uVar128 >= (int)uVar116) * uVar128;
                uVar131 = ((int)uVar131 < (int)uVar119) * uVar119 |
                          ((int)uVar131 >= (int)uVar119) * uVar131;
                uVar110 = (uint)((int)fVar89 < (int)fVar73) * (int)fVar89 |
                          (uint)((int)fVar89 >= (int)fVar73) * (int)fVar73;
                uVar113 = (uint)((int)fVar93 < (int)fVar77) * (int)fVar93 |
                          (uint)((int)fVar93 >= (int)fVar77) * (int)fVar77;
                uVar116 = (uint)((int)fVar97 < (int)fVar79) * (int)fVar97 |
                          (uint)((int)fVar97 >= (int)fVar79) * (int)fVar79;
                uVar119 = (uint)((int)fVar101 < (int)fVar81) * (int)fVar101 |
                          (uint)((int)fVar101 >= (int)fVar81) * (int)fVar81;
                uVar111 = ((int)uVar110 < (int)uVar122) * uVar122 |
                          ((int)uVar110 >= (int)uVar122) * uVar110;
                uVar114 = ((int)uVar113 < (int)uVar125) * uVar125 |
                          ((int)uVar113 >= (int)uVar125) * uVar113;
                uVar117 = ((int)uVar116 < (int)uVar128) * uVar128 |
                          ((int)uVar116 >= (int)uVar128) * uVar116;
                uVar120 = ((int)uVar119 < (int)uVar131) * uVar131 |
                          ((int)uVar119 >= (int)uVar131) * uVar119;
                uVar110 = (uint)((int)fVar83 < (int)fVar31) * (int)fVar31 |
                          (uint)((int)fVar83 >= (int)fVar31) * (int)fVar83;
                uVar113 = (uint)((int)fVar85 < (int)fVar43) * (int)fVar43 |
                          (uint)((int)fVar85 >= (int)fVar43) * (int)fVar85;
                uVar116 = (uint)((int)fVar86 < (int)fVar44) * (int)fVar44 |
                          (uint)((int)fVar86 >= (int)fVar44) * (int)fVar86;
                uVar119 = (uint)((int)fVar87 < (int)fVar45) * (int)fVar45 |
                          (uint)((int)fVar87 >= (int)fVar45) * (int)fVar87;
                uVar122 = (uint)((int)fVar104 < (int)fVar64) * (int)fVar64 |
                          (uint)((int)fVar104 >= (int)fVar64) * (int)fVar104;
                uVar125 = (uint)((int)fVar107 < (int)fVar68) * (int)fVar68 |
                          (uint)((int)fVar107 >= (int)fVar68) * (int)fVar107;
                uVar128 = (uint)((int)fVar108 < (int)fVar69) * (int)fVar69 |
                          (uint)((int)fVar108 >= (int)fVar69) * (int)fVar108;
                uVar131 = (uint)((int)fVar109 < (int)fVar71) * (int)fVar71 |
                          (uint)((int)fVar109 >= (int)fVar71) * (int)fVar109;
                uVar122 = ((int)uVar110 < (int)uVar122) * uVar110 |
                          ((int)uVar110 >= (int)uVar122) * uVar122;
                uVar125 = ((int)uVar113 < (int)uVar125) * uVar113 |
                          ((int)uVar113 >= (int)uVar125) * uVar125;
                uVar128 = ((int)uVar116 < (int)uVar128) * uVar116 |
                          ((int)uVar116 >= (int)uVar128) * uVar128;
                uVar131 = ((int)uVar119 < (int)uVar131) * uVar119 |
                          ((int)uVar119 >= (int)uVar131) * uVar131;
                uVar110 = (uint)((int)fVar89 < (int)fVar73) * (int)fVar73 |
                          (uint)((int)fVar89 >= (int)fVar73) * (int)fVar89;
                uVar113 = (uint)((int)fVar93 < (int)fVar77) * (int)fVar77 |
                          (uint)((int)fVar93 >= (int)fVar77) * (int)fVar93;
                uVar116 = (uint)((int)fVar97 < (int)fVar79) * (int)fVar79 |
                          (uint)((int)fVar97 >= (int)fVar79) * (int)fVar97;
                uVar119 = (uint)((int)fVar101 < (int)fVar81) * (int)fVar81 |
                          (uint)((int)fVar101 >= (int)fVar81) * (int)fVar101;
                uVar110 = ((int)uVar122 < (int)uVar110) * uVar122 |
                          ((int)uVar122 >= (int)uVar110) * uVar110;
                uVar113 = ((int)uVar125 < (int)uVar113) * uVar125 |
                          ((int)uVar125 >= (int)uVar113) * uVar113;
                uVar116 = ((int)uVar128 < (int)uVar116) * uVar128 |
                          ((int)uVar128 >= (int)uVar116) * uVar116;
                uVar119 = ((int)uVar131 < (int)uVar119) * uVar131 |
                          ((int)uVar131 >= (int)uVar119) * uVar119;
                bVar29 = (float)((tray.tnear.field_0.i[0] < (int)uVar111) * uVar111 |
                                (uint)(tray.tnear.field_0.i[0] >= (int)uVar111) *
                                tray.tnear.field_0.i[0]) <=
                         (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar110) *
                                 tray.tfar.field_0.i[0] |
                                (tray.tfar.field_0.i[0] >= (int)uVar110) * uVar110);
                bVar5 = (float)((tray.tnear.field_0.i[1] < (int)uVar114) * uVar114 |
                               (uint)(tray.tnear.field_0.i[1] >= (int)uVar114) *
                               tray.tnear.field_0.i[1]) <=
                        (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar113) *
                                tray.tfar.field_0.i[1] |
                               (tray.tfar.field_0.i[1] >= (int)uVar113) * uVar113);
                bVar6 = (float)((tray.tnear.field_0.i[2] < (int)uVar117) * uVar117 |
                               (uint)(tray.tnear.field_0.i[2] >= (int)uVar117) *
                               tray.tnear.field_0.i[2]) <=
                        (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar116) *
                                tray.tfar.field_0.i[2] |
                               (tray.tfar.field_0.i[2] >= (int)uVar116) * uVar116);
                bVar7 = (float)((tray.tnear.field_0.i[3] < (int)uVar120) * uVar120 |
                               (uint)(tray.tnear.field_0.i[3] >= (int)uVar120) *
                               tray.tnear.field_0.i[3]) <=
                        (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar119) *
                                tray.tfar.field_0.i[3] |
                               (tray.tfar.field_0.i[3] >= (int)uVar119) * uVar119);
                if (uVar17 == 6) {
                  fVar45 = *(float *)(uVar18 + 0xe0 + (long)pIVar23 * 4);
                  fVar64 = *(float *)(uVar18 + 0xf0 + (long)pIVar23 * 4);
                  bVar29 = (fVar53 < fVar64 && fVar45 <= fVar53) && bVar29;
                  bVar5 = (fVar58 < fVar64 && fVar45 <= fVar58) && bVar5;
                  bVar6 = (fVar60 < fVar64 && fVar45 <= fVar60) && bVar6;
                  bVar7 = (fVar62 < fVar64 && fVar45 <= fVar62) && bVar7;
                }
                auVar38._0_4_ = (-(uint)bVar29 & -(uint)bVar30) << 0x1f;
                auVar38._4_4_ = (-(uint)bVar5 & -(uint)bVar8) << 0x1f;
                auVar38._8_4_ = (-(uint)bVar6 & -(uint)bVar9) << 0x1f;
                auVar38._12_4_ = (-(uint)bVar7 & -(uint)bVar10) << 0x1f;
                uVar110 = movmskps((int)valid_i,auVar38);
                valid_i = (vint<4> *)(ulong)uVar110;
                if (uVar110 != 0) {
                  auVar54._4_4_ = fVar92;
                  auVar54._0_4_ = fVar88;
                  auVar54._8_4_ = fVar96;
                  auVar54._12_4_ = fVar100;
                  auVar11._4_4_ = uVar114;
                  auVar11._0_4_ = uVar111;
                  auVar11._8_4_ = uVar117;
                  auVar11._12_4_ = uVar120;
                  auVar65 = blendvps(auVar54,auVar11,auVar38);
                  if (root.ptr != 8) {
                    pNVar28->ptr = root.ptr;
                    pNVar28 = pNVar28 + 1;
                    paVar27->v[0] = (float)local_19b8;
                    paVar27->v[1] = local_19b8._4_4_;
                    paVar27->v[2] = (float)uStack_19b0;
                    paVar27->v[3] = uStack_19b0._4_4_;
                    paVar27 = paVar27 + 1;
                  }
                  local_19b8._0_4_ = auVar65._0_4_;
                  local_19b8._4_4_ = auVar65._4_4_;
                  uStack_19b0._0_4_ = auVar65._8_4_;
                  uStack_19b0._4_4_ = auVar65._12_4_;
                  root.ptr = sVar1;
                }
              }
            } while ((sVar1 != 8) &&
                    (valid_i = (vint<4> *)((long)&pIVar23->ptr + 1),
                    bVar29 = pIVar23 < (Intersectors *)0x3, pIVar23 = (Intersectors *)valid_i,
                    bVar29));
            iVar16 = 0;
            if (root.ptr == 8) {
              bVar30 = false;
              iVar16 = 4;
            }
            else {
              auVar39._4_4_ = -(uint)(local_19b8._4_4_ < tray.tfar.field_0.v[1]);
              auVar39._0_4_ = -(uint)((float)local_19b8 < tray.tfar.field_0.v[0]);
              auVar39._8_4_ = -(uint)((float)uStack_19b0 < tray.tfar.field_0.v[2]);
              auVar39._12_4_ = -(uint)(uStack_19b0._4_4_ < tray.tfar.field_0.v[3]);
              uVar21 = movmskps(uVar17,auVar39);
              bVar30 = true;
              if ((uint)POPCOUNT(uVar21) <= uVar25) {
                pNVar28->ptr = root.ptr;
                pNVar28 = pNVar28 + 1;
                paVar27->v[0] = (float)local_19b8;
                paVar27->v[1] = local_19b8._4_4_;
                paVar27->v[2] = (float)uStack_19b0;
                paVar27->v[3] = uStack_19b0._4_4_;
                paVar27 = paVar27 + 1;
                bVar30 = false;
                iVar16 = 4;
              }
            }
          } while (bVar30);
        }
      }
      goto LAB_00240c2d;
    }
  }
  return;
  while( true ) {
    pIVar23 = (Intersectors *)((long)&pIVar23->ptr + 1);
    lVar24 = lVar24 + 0x140;
    if (valid_i <= pIVar23) break;
LAB_002402de:
    iVar16 = local_19f8._0_4_;
    iVar59 = local_19f8._4_4_;
    iVar61 = local_19f8._8_4_;
    iVar63 = local_19f8._12_4_;
    fVar89 = auVar47._0_4_;
    fVar73 = auVar47._4_4_;
    fVar81 = auVar47._8_4_;
    fVar83 = auVar47._12_4_;
    uVar18 = 0;
    fVar45 = (float)local_19e8._0_4_;
    fVar64 = (float)local_19e8._4_4_;
    fVar87 = (float)uStack_19e0;
    fVar71 = uStack_19e0._4_4_;
    auVar65 = auVar66;
    while( true ) {
      auVar34 = _local_19a8;
      uVar17 = *(uint *)(lVar24 + -0x10 + uVar18 * 4);
      if ((ulong)uVar17 == 0xffffffff) break;
      local_19b8 = CONCAT44(local_1998._4_4_,(undefined4)local_1998);
      uStack_19b0._0_4_ = (float)(undefined4)uStack_1990;
      uStack_19b0._4_4_ = (float)uStack_1990._4_4_;
      fVar68 = *(float *)(ray + 0x50);
      fVar69 = *(float *)(ray + 0x54);
      fVar77 = *(float *)(ray + 0x58);
      fVar79 = *(float *)(ray + 0x5c);
      fVar85 = *(float *)(ray + 0x60);
      fVar86 = *(float *)(ray + 100);
      fVar104 = *(float *)(ray + 0x68);
      fVar107 = *(float *)(ray + 0x6c);
      fVar108 = *(float *)(ray + 0x70);
      fVar109 = *(float *)(ray + 0x74);
      fVar70 = *(float *)(ray + 0x78);
      fVar72 = *(float *)(ray + 0x7c);
      fVar88 = *(float *)(lVar24 + -0xa0 + uVar18 * 4);
      fVar92 = *(float *)(lVar24 + -0x90 + uVar18 * 4);
      fVar96 = *(float *)(lVar24 + -0x80 + uVar18 * 4);
      fVar100 = *(float *)(lVar24 + -0x130 + uVar18 * 4);
      fVar93 = *(float *)(lVar24 + -0x120 + uVar18 * 4);
      fVar97 = *(float *)(lVar24 + -0x110 + uVar18 * 4);
      fVar101 = *(float *)(lVar24 + -0x100 + uVar18 * 4);
      fVar136 = fVar88 * fVar108 + fVar100;
      fVar137 = fVar88 * fVar109 + fVar100;
      fVar138 = fVar88 * fVar70 + fVar100;
      fVar100 = fVar88 * fVar72 + fVar100;
      fVar112 = fVar92 * fVar108 + fVar93;
      fVar115 = fVar92 * fVar109 + fVar93;
      fVar118 = fVar92 * fVar70 + fVar93;
      fVar93 = fVar92 * fVar72 + fVar93;
      fVar123 = fVar96 * fVar108 + fVar97;
      fVar126 = fVar96 * fVar109 + fVar97;
      fVar129 = fVar96 * fVar70 + fVar97;
      fVar97 = fVar96 * fVar72 + fVar97;
      fVar88 = *(float *)(lVar24 + -0x70 + uVar18 * 4);
      fVar92 = *(float *)(lVar24 + -0x60 + uVar18 * 4);
      fVar96 = *(float *)(lVar24 + -0x50 + uVar18 * 4);
      fVar46 = *(float *)(lVar24 + -0xf0 + uVar18 * 4);
      fVar31 = *(float *)(lVar24 + -0xe0 + uVar18 * 4);
      fVar43 = *(float *)(lVar24 + -0x40 + uVar18 * 4);
      fVar44 = *(float *)(lVar24 + -0x30 + uVar18 * 4);
      fVar53 = *(float *)(lVar24 + -0x20 + uVar18 * 4);
      fVar58 = *(float *)(lVar24 + -0xd0 + uVar18 * 4);
      fVar60 = *(float *)(lVar24 + -0xc0 + uVar18 * 4);
      fVar62 = *(float *)(lVar24 + -0xb0 + uVar18 * 4);
      fVar74 = fVar136 - (fVar88 * fVar108 + fVar101);
      fVar78 = fVar137 - (fVar88 * fVar109 + fVar101);
      fVar80 = fVar138 - (fVar88 * fVar70 + fVar101);
      fVar82 = fVar100 - (fVar88 * fVar72 + fVar101);
      fVar143 = fVar112 - (fVar92 * fVar108 + fVar46);
      fVar144 = fVar115 - (fVar92 * fVar109 + fVar46);
      fVar145 = fVar118 - (fVar92 * fVar70 + fVar46);
      fVar146 = fVar93 - (fVar92 * fVar72 + fVar46);
      fVar90 = fVar123 - (fVar96 * fVar108 + fVar31);
      fVar94 = fVar126 - (fVar96 * fVar109 + fVar31);
      fVar98 = fVar129 - (fVar96 * fVar70 + fVar31);
      fVar102 = fVar97 - (fVar96 * fVar72 + fVar31);
      fVar132 = (fVar43 * fVar108 + fVar58) - fVar136;
      fVar133 = (fVar43 * fVar109 + fVar58) - fVar137;
      fVar134 = (fVar43 * fVar70 + fVar58) - fVar138;
      fVar135 = (fVar43 * fVar72 + fVar58) - fVar100;
      fVar139 = (fVar44 * fVar108 + fVar60) - fVar112;
      fVar140 = (fVar44 * fVar109 + fVar60) - fVar115;
      fVar141 = (fVar44 * fVar70 + fVar60) - fVar118;
      fVar142 = (fVar44 * fVar72 + fVar60) - fVar93;
      fVar147 = (fVar53 * fVar108 + fVar62) - fVar123;
      fVar148 = (fVar53 * fVar109 + fVar62) - fVar126;
      fVar149 = (fVar53 * fVar70 + fVar62) - fVar129;
      fVar150 = (fVar53 * fVar72 + fVar62) - fVar97;
      local_19f8._0_4_ = fVar90 * fVar139 - fVar143 * fVar147;
      local_19f8._4_4_ = fVar94 * fVar140 - fVar144 * fVar148;
      uStack_19f0._0_4_ = fVar98 * fVar141 - fVar145 * fVar149;
      uStack_19f0._4_4_ = fVar102 * fVar142 - fVar146 * fVar150;
      fVar91 = fVar74 * fVar147 - fVar90 * fVar132;
      fVar95 = fVar78 * fVar148 - fVar94 * fVar133;
      fVar99 = fVar80 * fVar149 - fVar98 * fVar134;
      fVar103 = fVar82 * fVar150 - fVar102 * fVar135;
      local_19a8._0_4_ = fVar143 * fVar132 - fVar74 * fVar139;
      local_19a8._4_4_ = fVar144 * fVar133 - fVar78 * fVar140;
      fStack_19a0 = fVar145 * fVar134 - fVar80 * fVar141;
      fStack_199c = fVar146 * fVar135 - fVar82 * fVar142;
      fVar136 = fVar136 - *(float *)ray;
      fVar137 = fVar137 - *(float *)(ray + 4);
      fVar138 = fVar138 - *(float *)(ray + 8);
      fVar100 = fVar100 - *(float *)(ray + 0xc);
      fVar112 = fVar112 - *(float *)(ray + 0x10);
      fVar115 = fVar115 - *(float *)(ray + 0x14);
      fVar118 = fVar118 - *(float *)(ray + 0x18);
      fVar93 = fVar93 - *(float *)(ray + 0x1c);
      fVar123 = fVar123 - *(float *)(ray + 0x20);
      fVar126 = fVar126 - *(float *)(ray + 0x24);
      fVar129 = fVar129 - *(float *)(ray + 0x28);
      fVar97 = fVar97 - *(float *)(ray + 0x2c);
      fVar46 = fVar112 * fVar85 - fVar123 * fVar68;
      fVar31 = fVar115 * fVar86 - fVar126 * fVar69;
      fVar43 = fVar118 * fVar104 - fVar129 * fVar77;
      fVar44 = fVar93 * fVar107 - fVar97 * fVar79;
      fVar88 = *(float *)(ray + 0x40);
      fVar92 = *(float *)(ray + 0x44);
      fVar96 = *(float *)(ray + 0x48);
      fVar101 = *(float *)(ray + 0x4c);
      fVar53 = fVar123 * fVar88 - fVar136 * fVar85;
      fVar58 = fVar126 * fVar92 - fVar137 * fVar86;
      fVar60 = fVar129 * fVar96 - fVar138 * fVar104;
      fVar62 = fVar97 * fVar101 - fVar100 * fVar107;
      fVar108 = fVar136 * fVar68 - fVar112 * fVar88;
      fVar109 = fVar137 * fVar69 - fVar115 * fVar92;
      fVar70 = fVar138 * fVar77 - fVar118 * fVar96;
      fVar72 = fVar100 * fVar79 - fVar93 * fVar101;
      fVar68 = fVar88 * (float)local_19f8._0_4_ + fVar68 * fVar91 + fVar85 * (float)local_19a8._0_4_
      ;
      fVar69 = fVar92 * (float)local_19f8._4_4_ + fVar69 * fVar95 + fVar86 * (float)local_19a8._4_4_
      ;
      fVar77 = fVar96 * (float)(undefined4)uStack_19f0 + fVar77 * fVar99 + fVar104 * fStack_19a0;
      fVar79 = fVar101 * (float)uStack_19f0._4_4_ + fVar79 * fVar103 + fVar107 * fStack_199c;
      uVar122 = (uint)fVar68 & 0x80000000;
      uVar125 = (uint)fVar69 & 0x80000000;
      uVar128 = (uint)fVar77 & 0x80000000;
      uVar131 = (uint)fVar79 & 0x80000000;
      fVar88 = (float)((uint)(fVar132 * fVar46 + fVar139 * fVar53 + fVar147 * fVar108) ^ uVar122);
      fVar92 = (float)((uint)(fVar133 * fVar31 + fVar140 * fVar58 + fVar148 * fVar109) ^ uVar125);
      fVar96 = (float)((uint)(fVar134 * fVar43 + fVar141 * fVar60 + fVar149 * fVar70) ^ uVar128);
      fVar101 = (float)((uint)(fVar135 * fVar44 + fVar142 * fVar62 + fVar150 * fVar72) ^ uVar131);
      auVar76._0_4_ = -(uint)(0.0 <= fVar88) & auVar65._0_4_;
      auVar76._4_4_ = -(uint)(0.0 <= fVar92) & auVar65._4_4_;
      auVar76._8_4_ = -(uint)(0.0 <= fVar96) & auVar65._8_4_;
      auVar76._12_4_ = -(uint)(0.0 <= fVar101) & auVar65._12_4_;
      iVar22 = movmskps(0xffffffff,auVar76);
      local_1948 = auVar52._0_4_;
      uStack_1944 = auVar52._4_4_;
      uStack_1940 = auVar52._8_4_;
      uStack_193c = auVar52._12_4_;
      uVar110 = local_1948;
      uVar113 = uStack_1944;
      uVar116 = uStack_1940;
      uVar119 = uStack_193c;
      if (iVar22 == 0) {
LAB_002405b9:
        local_19e8._4_4_ = fVar64;
        local_19e8._0_4_ = fVar45;
        uStack_19e0._4_4_ = fVar71;
        uStack_19e0._0_4_ = fVar87;
        auVar47._4_4_ = fVar73;
        auVar47._0_4_ = fVar89;
        auVar47._8_4_ = fVar81;
        auVar47._12_4_ = fVar83;
        local_19f8._4_4_ = iVar59;
        local_19f8._0_4_ = iVar16;
        uStack_19f0._4_4_ = iVar63;
        uStack_19f0._0_4_ = iVar61;
        local_1998 = local_19b8;
        uStack_1990 = uStack_19b0;
        _local_19a8 = auVar34;
        fVar88 = local_19c8;
        fVar92 = fStack_19c4;
        fVar96 = fStack_19c0;
        fVar101 = fStack_19bc;
        fVar46 = local_19d8;
        fVar31 = fStack_19d4;
        fVar43 = fStack_19d0;
        fVar44 = fStack_19cc;
      }
      else {
        local_1998 = CONCAT44(fVar95,fVar91);
        uStack_1990 = CONCAT44(fVar103,fVar99);
        fVar46 = (float)((uint)(fVar74 * fVar46 + fVar143 * fVar53 + fVar90 * fVar108) ^ uVar122);
        fVar31 = (float)((uint)(fVar78 * fVar31 + fVar144 * fVar58 + fVar94 * fVar109) ^ uVar125);
        fVar43 = (float)((uint)(fVar80 * fVar43 + fVar145 * fVar60 + fVar98 * fVar70) ^ uVar128);
        fVar44 = (float)((uint)(fVar82 * fVar44 + fVar146 * fVar62 + fVar102 * fVar72) ^ uVar131);
        auVar50._0_4_ = -(uint)(0.0 <= fVar46) & auVar76._0_4_;
        auVar50._4_4_ = -(uint)(0.0 <= fVar31) & auVar76._4_4_;
        auVar50._8_4_ = -(uint)(0.0 <= fVar43) & auVar76._8_4_;
        auVar50._12_4_ = -(uint)(0.0 <= fVar44) & auVar76._12_4_;
        iVar22 = movmskps(iVar22,auVar50);
        if (iVar22 == 0) goto LAB_002405b9;
        fVar53 = ABS(fVar68);
        fVar58 = ABS(fVar69);
        fVar60 = ABS(fVar77);
        fVar62 = ABS(fVar79);
        auVar47._8_4_ = fVar60;
        auVar47._0_8_ = CONCAT44(fVar69,fVar68) & 0x7fffffff7fffffff;
        auVar47._12_4_ = fVar62;
        auVar42._0_4_ = -(uint)(fVar46 <= fVar53 - fVar88) & auVar50._0_4_;
        auVar42._4_4_ = -(uint)(fVar31 <= fVar58 - fVar92) & auVar50._4_4_;
        auVar42._8_4_ = -(uint)(fVar43 <= fVar60 - fVar96) & auVar50._8_4_;
        auVar42._12_4_ = -(uint)(fVar44 <= fVar62 - fVar101) & auVar50._12_4_;
        iVar22 = movmskps(iVar22,auVar42);
        if (iVar22 == 0) {
LAB_002409e7:
          local_19e8._4_4_ = fVar64;
          local_19e8._0_4_ = fVar45;
          uStack_19e0._4_4_ = fVar71;
          uStack_19e0._0_4_ = fVar87;
          auVar47._4_4_ = fVar73;
          auVar47._0_4_ = fVar89;
          auVar47._8_4_ = fVar81;
          auVar47._12_4_ = fVar83;
          local_19f8._4_4_ = iVar59;
          local_19f8._0_4_ = iVar16;
          uStack_19f0._4_4_ = iVar63;
          uStack_19f0._0_4_ = iVar61;
          local_1998 = local_19b8;
          uStack_1990 = uStack_19b0;
          _local_19a8 = auVar34;
          fVar88 = local_19c8;
          fVar92 = fStack_19c4;
          fVar96 = fStack_19c0;
          fVar101 = fStack_19bc;
          fVar46 = local_19d8;
          fVar31 = fStack_19d4;
          fVar43 = fStack_19d0;
          fVar44 = fStack_19cc;
        }
        else {
          local_19e8._0_4_ =
               uVar122 ^ (uint)(fVar136 * (float)local_19f8._0_4_ +
                               fVar112 * fVar91 + fVar123 * (float)local_19a8._0_4_);
          local_19e8._4_4_ =
               uVar125 ^ (uint)(fVar137 * (float)local_19f8._4_4_ +
                               fVar115 * fVar95 + fVar126 * (float)local_19a8._4_4_);
          uStack_19e0._0_4_ =
               (float)(uVar128 ^
                      (uint)(fVar138 * (float)(undefined4)uStack_19f0 +
                            fVar118 * fVar99 + fVar129 * fStack_19a0));
          uStack_19e0._4_4_ =
               (float)(uVar131 ^
                      (uint)(fVar100 * (float)uStack_19f0._4_4_ +
                            fVar93 * fVar103 + fVar97 * fStack_199c));
          auVar51._0_4_ =
               -(uint)((float)local_19e8._0_4_ <= *(float *)(ray + 0x80) * fVar53 &&
                      *(float *)(ray + 0x30) * fVar53 < (float)local_19e8._0_4_) & auVar42._0_4_;
          auVar51._4_4_ =
               -(uint)((float)local_19e8._4_4_ <= *(float *)(ray + 0x84) * fVar58 &&
                      *(float *)(ray + 0x34) * fVar58 < (float)local_19e8._4_4_) & auVar42._4_4_;
          auVar51._8_4_ =
               -(uint)((float)uStack_19e0 <= *(float *)(ray + 0x88) * fVar60 &&
                      *(float *)(ray + 0x38) * fVar60 < (float)uStack_19e0) & auVar42._8_4_;
          auVar51._12_4_ =
               -(uint)(uStack_19e0._4_4_ <= *(float *)(ray + 0x8c) * fVar62 &&
                      *(float *)(ray + 0x3c) * fVar62 < uStack_19e0._4_4_) & auVar42._12_4_;
          iVar22 = movmskps(iVar22,auVar51);
          if (iVar22 == 0) goto LAB_002409e7;
          uVar110 = -(uint)(fVar68 != 0.0) & auVar51._0_4_;
          uVar113 = -(uint)(fVar69 != 0.0) & auVar51._4_4_;
          uVar116 = -(uint)(fVar77 != 0.0) & auVar51._8_4_;
          uVar119 = -(uint)(fVar79 != 0.0) & auVar51._12_4_;
          auVar13._4_4_ = uVar113;
          auVar13._0_4_ = uVar110;
          auVar13._8_4_ = uVar116;
          auVar13._12_4_ = uVar119;
          iVar22 = movmskps(iVar22,auVar13);
          if (iVar22 == 0) {
            local_19e8._4_4_ = fVar64;
            local_19e8._0_4_ = fVar45;
            uStack_19e0._4_4_ = fVar71;
            uStack_19e0._0_4_ = fVar87;
            auVar47._4_4_ = fVar73;
            auVar47._0_4_ = fVar89;
            auVar47._8_4_ = fVar81;
            auVar47._12_4_ = fVar83;
            local_19f8._4_4_ = iVar59;
            local_19f8._0_4_ = iVar16;
            uStack_19f0._4_4_ = iVar63;
            uStack_19f0._0_4_ = iVar61;
            local_1998 = local_19b8;
            uStack_1990 = uStack_19b0;
            uVar110 = local_1948;
            uVar113 = uStack_1944;
            uVar116 = uStack_1940;
            uVar119 = uStack_193c;
            _local_19a8 = auVar34;
            fVar88 = local_19c8;
            fVar92 = fStack_19c4;
            fVar96 = fStack_19c0;
            fVar101 = fStack_19bc;
            fVar46 = local_19d8;
            fVar31 = fStack_19d4;
            fVar43 = fStack_19d0;
            fVar44 = fStack_19cc;
          }
        }
      }
      fStack_19cc = fVar44;
      fStack_19d0 = fVar43;
      fStack_19d4 = fVar31;
      local_19d8 = fVar46;
      fStack_19bc = fVar101;
      fStack_19c0 = fVar96;
      fStack_19c4 = fVar92;
      local_19c8 = fVar88;
      pRVar2 = (context->scene->geometries).items;
      pGVar3 = pRVar2[uVar17].ptr;
      uVar122 = pGVar3->mask;
      auVar48._0_4_ = -(uint)((uVar122 & *(uint *)(ray + 0x90)) == 0);
      auVar48._4_4_ = -(uint)((uVar122 & *(uint *)(ray + 0x94)) == 0);
      auVar48._8_4_ = -(uint)((uVar122 & *(uint *)(ray + 0x98)) == 0);
      auVar48._12_4_ = -(uint)((uVar122 & *(uint *)(ray + 0x9c)) == 0);
      auVar12._4_4_ = uVar113;
      auVar12._0_4_ = uVar110;
      auVar12._8_4_ = uVar116;
      auVar12._12_4_ = uVar119;
      auVar49 = ~auVar48 & auVar12;
      iVar16 = movmskps((int)pRVar2,auVar49);
      fVar89 = auVar47._0_4_;
      fVar73 = auVar47._4_4_;
      fVar81 = auVar47._8_4_;
      fVar83 = auVar47._12_4_;
      if (iVar16 != 0) {
        uVar21 = *(undefined4 *)(lVar24 + uVar18 * 4);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar34 = rcpps(ZEXT416(uVar122),auVar47);
          fVar88 = auVar34._0_4_;
          fVar92 = auVar34._4_4_;
          fVar96 = auVar34._8_4_;
          fVar100 = auVar34._12_4_;
          fVar88 = (1.0 - fVar89 * fVar88) * fVar88 + fVar88;
          fVar92 = (1.0 - fVar73 * fVar92) * fVar92 + fVar92;
          fVar96 = (1.0 - fVar81 * fVar96) * fVar96 + fVar96;
          fVar100 = (1.0 - fVar83 * fVar100) * fVar100 + fVar100;
          local_1738 = local_19c8 * fVar88;
          fStack_1734 = fStack_19c4 * fVar92;
          fStack_1730 = fStack_19c0 * fVar96;
          fStack_172c = fStack_19bc * fVar100;
          local_1728 = local_19d8 * fVar88;
          fStack_1724 = fStack_19d4 * fVar92;
          fStack_1720 = fStack_19d0 * fVar96;
          fStack_171c = fStack_19cc * fVar100;
          local_1768 = local_19f8;
          uStack_1760 = uStack_19f0;
          local_1758 = local_1998;
          uStack_1750 = uStack_1990;
          local_1748 = local_19a8._0_4_;
          uStack_1744 = local_19a8._4_4_;
          uStack_1740 = fStack_19a0;
          uStack_173c = fStack_199c;
          auVar55._0_4_ = fVar88 * (float)local_19e8._0_4_;
          auVar55._4_4_ = fVar92 * (float)local_19e8._4_4_;
          auVar55._8_4_ = fVar96 * (float)uStack_19e0;
          auVar55._12_4_ = fVar100 * uStack_19e0._4_4_;
          local_16f8 = context->user->instID[0];
          local_16e8 = context->user->instPrimID[0];
          auVar34 = *(undefined1 (*) [16])(ray + 0x80);
          auVar67 = blendvps(auVar34,auVar55,auVar49);
          *(undefined1 (*) [16])(ray + 0x80) = auVar67;
          args.valid = (int *)local_18c8;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          pRVar20 = (RTCRayN *)pGVar3->occlusionFilterN;
          local_18c8 = auVar49;
          args.ray = (RTCRayN *)ray;
          local_1718 = uVar21;
          uStack_1714 = uVar21;
          uStack_1710 = uVar21;
          uStack_170c = uVar21;
          local_1708 = uVar17;
          uStack_1704 = uVar17;
          uStack_1700 = uVar17;
          uStack_16fc = uVar17;
          uStack_16f4 = local_16f8;
          uStack_16f0 = local_16f8;
          uStack_16ec = local_16f8;
          uStack_16e4 = local_16e8;
          uStack_16e0 = local_16e8;
          uStack_16dc = local_16e8;
          if (pRVar20 != (RTCRayN *)0x0) {
            pRVar20 = (RTCRayN *)(*(code *)pRVar20)(&args);
          }
          if (local_18c8 == (undefined1  [16])0x0) {
            auVar56._8_4_ = 0xffffffff;
            auVar56._0_8_ = 0xffffffffffffffff;
            auVar56._12_4_ = 0xffffffff;
            auVar56 = auVar56 ^ _DAT_01febe20;
          }
          else {
            p_Var4 = context->args->filter;
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
            }
            auVar41._0_4_ = -(uint)(local_18c8._0_4_ == 0);
            auVar41._4_4_ = -(uint)(local_18c8._4_4_ == 0);
            auVar41._8_4_ = -(uint)(local_18c8._8_4_ == 0);
            auVar41._12_4_ = -(uint)(local_18c8._12_4_ == 0);
            auVar56 = auVar41 ^ _DAT_01febe20;
            auVar67 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar41);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
            pRVar20 = args.ray;
          }
          uVar17 = (uint)pRVar20;
          auVar57._0_4_ = auVar56._0_4_ << 0x1f;
          auVar57._4_4_ = auVar56._4_4_ << 0x1f;
          auVar57._8_4_ = auVar56._8_4_ << 0x1f;
          auVar57._12_4_ = auVar56._12_4_ << 0x1f;
          auVar49._0_4_ = auVar57._0_4_ >> 0x1f;
          auVar49._4_4_ = auVar57._4_4_ >> 0x1f;
          auVar49._8_4_ = auVar57._8_4_ >> 0x1f;
          auVar49._12_4_ = auVar57._12_4_ >> 0x1f;
          auVar34 = blendvps(auVar34,*(undefined1 (*) [16])(ray + 0x80),auVar57);
          *(undefined1 (*) [16])(ray + 0x80) = auVar34;
        }
        auVar65 = ~auVar49 & auVar65;
      }
      fVar100 = INFINITY;
      fVar96 = INFINITY;
      fVar92 = INFINITY;
      fVar88 = INFINITY;
      uVar17 = movmskps(uVar17,auVar65);
      uVar19 = (ulong)uVar17;
      iVar16 = local_19f8._0_4_;
      iVar59 = local_19f8._4_4_;
      iVar61 = local_19f8._8_4_;
      iVar63 = local_19f8._12_4_;
      if ((uVar17 == 0) ||
         (uVar19 = uVar18 + 1, bVar30 = 2 < uVar18, uVar18 = uVar19,
         fVar45 = (float)local_19e8._0_4_, fVar64 = (float)local_19e8._4_4_,
         fVar87 = (float)uStack_19e0, fVar71 = uStack_19e0._4_4_, bVar30)) goto LAB_00240b9a;
    }
    local_19e8._4_4_ = fVar64;
    local_19e8._0_4_ = fVar45;
    uStack_19e0._0_4_ = fVar87;
    uStack_19e0._4_4_ = fVar71;
    auVar47._4_4_ = fVar73;
    auVar47._0_4_ = fVar89;
    auVar47._8_4_ = fVar81;
    auVar47._12_4_ = fVar83;
    local_19f8._4_4_ = iVar59;
    local_19f8._0_4_ = iVar16;
    uStack_19f0._0_4_ = iVar61;
    uStack_19f0._4_4_ = iVar63;
    uVar19 = 0xffffffff;
LAB_00240b9a:
    local_1788 = auVar66._0_4_;
    uStack_1784 = auVar66._4_4_;
    uStack_1780 = auVar66._8_4_;
    uStack_177c = auVar66._12_4_;
    auVar66._0_4_ = local_1788 & auVar65._0_4_;
    auVar66._4_4_ = uStack_1784 & auVar65._4_4_;
    auVar66._8_4_ = uStack_1780 & auVar65._8_4_;
    auVar66._12_4_ = uStack_177c & auVar65._12_4_;
    iVar16 = movmskps((int)uVar19,auVar66);
    if (iVar16 == 0) break;
  }
  uVar18 = CONCAT44(auVar66._4_4_,auVar66._0_4_);
  terminated.field_0._0_8_ = uVar18 ^ 0xffffffffffffffff;
  terminated.field_0.i[2] = auVar66._8_4_ ^ 0xffffffff;
  terminated.field_0.i[3] = auVar66._12_4_ ^ 0xffffffff;
LAB_00240bef:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])vVar15.field_0 | (undefined1  [16])terminated.field_0);
  iVar16 = movmskps(iVar16,(undefined1  [16])terminated.field_0);
  if (iVar16 == 0xf) {
LAB_00240c2a:
    iVar16 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    iVar16 = 0;
  }
LAB_00240c2d:
  paVar26 = paVar27;
  if (iVar16 == 3) {
    auVar52._0_4_ = uVar121 & terminated.field_0.i[0];
    auVar52._4_4_ = uVar124 & terminated.field_0.i[1];
    auVar52._8_4_ = uVar127 & terminated.field_0.i[2];
    auVar52._12_4_ = uVar130 & terminated.field_0.i[3];
    auVar52 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar52);
    *(undefined1 (*) [16])(ray + 0x80) = auVar52;
    return;
  }
  goto LAB_0023ff92;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }